

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDB_CoalescedMSFStream.cpp
# Opt level: O0

void __thiscall
PDB::CoalescedMSFStream::CoalescedMSFStream
          (CoalescedMSFStream *this,void *data,uint32_t blockSize,uint32_t *blockIndices,
          uint32_t streamSize)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  Byte *pBVar4;
  size_t sVar5;
  void *pvVar6;
  void *sourceData_1;
  size_t fileOffset_2;
  uint32_t index_2;
  uint32_t remainingBytes;
  void *sourceData;
  size_t fileOffset_1;
  uint local_48;
  uint32_t index_1;
  uint32_t i;
  uint32_t fullBlockCount;
  Byte *destination;
  size_t fileOffset;
  uint32_t index;
  uint32_t streamSize_local;
  uint32_t *blockIndices_local;
  uint32_t blockSize_local;
  void *data_local;
  CoalescedMSFStream *this_local;
  
  this->m_ownedData = (Byte *)0x0;
  this->m_data = (Byte *)0x0;
  this->m_size = (ulong)streamSize;
  bVar1 = anon_unknown.dwarf_35432::AreBlockIndicesContiguous(blockIndices,blockSize,streamSize);
  if (bVar1) {
    sVar5 = ConvertBlockIndexToFileOffset(*blockIndices,blockSize);
    pBVar4 = Pointer::Offset<PDB::Byte_const*,void_const,unsigned_long>(data,sVar5);
    this->m_data = pBVar4;
  }
  else {
    pBVar4 = (Byte *)operator_new__((ulong)streamSize);
    this->m_ownedData = pBVar4;
    this->m_data = this->m_ownedData;
    _i = this->m_ownedData;
    uVar2 = streamSize / blockSize;
    for (local_48 = 0; local_48 < uVar2; local_48 = local_48 + 1) {
      sVar5 = ConvertBlockIndexToFileOffset(blockIndices[local_48],blockSize);
      pvVar6 = Pointer::Offset<void_const*,void_const,unsigned_long>(data,sVar5);
      memcpy(_i,pvVar6,(ulong)blockSize);
      _i = _i + blockSize;
    }
    uVar3 = streamSize - uVar2 * blockSize;
    if (uVar3 != 0) {
      sVar5 = ConvertBlockIndexToFileOffset(blockIndices[uVar2],blockSize);
      pvVar6 = Pointer::Offset<void_const*,void_const,unsigned_long>(data,sVar5);
      memcpy(_i,pvVar6,(ulong)uVar3);
    }
  }
  return;
}

Assistant:

PDB::CoalescedMSFStream::CoalescedMSFStream(const void* data, uint32_t blockSize, const uint32_t* blockIndices, uint32_t streamSize) PDB_NO_EXCEPT
	: m_ownedData(nullptr)
	, m_data(nullptr)
	, m_size(streamSize)
{
	if (AreBlockIndicesContiguous(blockIndices, blockSize, streamSize))
	{
		// fast path, all block indices are contiguous, so we don't have to copy any data at all.
		// instead, we directly point into the memory-mapped file at the correct offset.
		const uint32_t index = blockIndices[0];
		const size_t fileOffset = PDB::ConvertBlockIndexToFileOffset(index, blockSize);
		m_data = Pointer::Offset<const Byte*>(data, fileOffset);
	}
	else
	{
		// slower path, we need to copy disjunct blocks into our own data array, block by block
		m_ownedData = PDB_NEW_ARRAY(Byte, streamSize);
		m_data = m_ownedData;

		Byte* destination = m_ownedData;

		// copy full blocks first
		const uint32_t fullBlockCount = streamSize / blockSize;
		for (uint32_t i = 0u; i < fullBlockCount; ++i)
		{
			const uint32_t index = blockIndices[i];

			// read one single block at the correct offset in the stream
			const size_t fileOffset = PDB::ConvertBlockIndexToFileOffset(index, blockSize);
			const void* sourceData = Pointer::Offset<const void*>(data, fileOffset);
			std::memcpy(destination, sourceData, blockSize);

			destination += blockSize;
		}

		// account for non-full blocks
		const uint32_t remainingBytes = streamSize - (fullBlockCount * blockSize);
		if (remainingBytes != 0u)
		{
			const uint32_t index = blockIndices[fullBlockCount];

			// read remaining bytes at correct offset in the stream
			const size_t fileOffset = PDB::ConvertBlockIndexToFileOffset(index, blockSize);
			const void* sourceData = Pointer::Offset<const void*>(data, fileOffset);
			std::memcpy(destination, sourceData, remainingBytes);
		}
	}
}